

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2r2rect.cc
# Opt level: O2

bool __thiscall S2R2Rect::Contains(S2R2Rect *this,S2Point *p)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  double v;
  double u;
  double local_40;
  double local_38;
  R2Point local_30;
  
  iVar2 = S2::GetFace(p);
  if (iVar2 == 0) {
    S2::ValidFaceXYZtoUV(0,p,&local_38,&local_40);
    dVar3 = S2::UVtoST(local_38);
    local_30.c_[1] = S2::UVtoST(local_40);
    local_30.c_[0] = dVar3;
    bVar1 = R2Rect::Contains(&this->rect_,&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool S2R2Rect::Contains(const S2Point& p) const {
  if (S2::GetFace(p) != 0) return false;
  double u, v;
  S2::ValidFaceXYZtoUV(0, p, &u, &v);
  return Contains(R2Point(S2::UVtoST(u), S2::UVtoST(v)));
}